

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeTFTessControlShader::getTessellationControlShaderCode
          (TextureCubeMapArrayTextureSizeTFTessControlShader *this)

{
  TextureCubeMapArrayTextureSizeTFTessControlShader *this_local;
  
  return getTessellationControlShaderCode::result;
}

Assistant:

const char* TextureCubeMapArrayTextureSizeTFTessControlShader::getTessellationControlShaderCode(void)
{
	static const char* result =
		"${VERSION}\n"
		"\n"
		"${TESSELLATION_SHADER_ENABLE}\n"
		"${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"uniform highp samplerCubeArray       texture_std_sampler;\n"
		"uniform highp samplerCubeArrayShadow texture_shw_sampler;\n"
		"\n"
		"layout (location = 0) out flat uvec3 texture_std_size_array[];\n"
		"layout (location = 1) out flat uvec3 texture_shw_size_array[];\n"
		"\n"
		"layout (vertices = 1) out;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    texture_std_size_array[gl_InvocationID]    = uvec3( textureSize(texture_std_sampler, 0) );\n"
		"    texture_shw_size_array[gl_InvocationID]    = uvec3( textureSize(texture_shw_sampler, 0) );\n"
		"    gl_out[gl_InvocationID].gl_Position        = vec4(0.0f,0.0f,0.0f,0.0f);\n"
		"}\n";
	return result;
}